

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O1

void __thiscall
cfd::api::json::DecodePsbtResponse::ConvertFromStruct
          (DecodePsbtResponse *this,DecodePsbtResponseStruct *data)

{
  DecodeRawTransactionResponse::ConvertFromStruct(&this->tx_,&data->tx);
  std::__cxx11::string::_M_assign((string *)&this->tx_hex_);
  core::JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct>::ConvertFromStruct
            (&this->xpubs_,&data->xpubs);
  this->version_ = data->version;
  core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::ConvertFromStruct
            (&this->unknown_,&data->unknown);
  core::JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct>::ConvertFromStruct
            (&this->inputs_,&data->inputs);
  core::JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct>::
  ConvertFromStruct(&this->outputs_,&data->outputs);
  this->fee_ = data->fee;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void DecodePsbtResponse::ConvertFromStruct(
    const DecodePsbtResponseStruct& data) {
  tx_.ConvertFromStruct(data.tx);
  tx_hex_ = data.tx_hex;
  xpubs_.ConvertFromStruct(data.xpubs);
  version_ = data.version;
  unknown_.ConvertFromStruct(data.unknown);
  inputs_.ConvertFromStruct(data.inputs);
  outputs_.ConvertFromStruct(data.outputs);
  fee_ = data.fee;
  ignore_items = data.ignore_items;
}